

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

ColMatrix * __thiscall fizplex::Base::get_inverse(ColMatrix *__return_storage_ptr__,Base *this)

{
  pointer pEVar1;
  ulong uVar2;
  pointer pNVar3;
  unsigned_long *puVar4;
  SVector *pSVar5;
  Nonzero *n;
  pointer pNVar6;
  ulong uVar7;
  size_t i;
  size_t sVar8;
  
  ColMatrix::identity(__return_storage_ptr__,this->m);
  if (this->m != 0) {
    uVar7 = 0;
    do {
      sVar8 = 0;
      do {
        pEVar1 = (this->etms).
                 super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pSVar5 = ColMatrix::column(__return_storage_ptr__,sVar8);
        apply_etm(this,pEVar1 + uVar7,pSVar5);
        sVar8 = sVar8 + 1;
        uVar2 = this->m;
      } while (sVar8 < uVar2);
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar2);
    if (uVar2 != 0) {
      sVar8 = 0;
      do {
        pSVar5 = ColMatrix::column(__return_storage_ptr__,sVar8);
        pNVar6 = (pSVar5->values).
                 super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar3 = (pSVar5->values).
                 super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pNVar6 != pNVar3) {
          puVar4 = (this->row_ordering)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          do {
            pNVar6->index = puVar4[pNVar6->index];
            pNVar6 = pNVar6 + 1;
          } while (pNVar6 != pNVar3);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 < this->m);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ColMatrix Base::get_inverse() {
  auto inv = ColMatrix::identity(m);
  for (size_t ind = 0; ind < m; ++ind) {
    for (size_t i = 0; i < m; ++i)
      apply_etm(etms[ind], inv.column(i));
  }

  for (size_t col = 0; col < m; ++col) {
    for (auto &n : inv.column(col))
      n.index = row_ordering[n.index];
  }
  return inv;
}